

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O2

void __thiscall
EmitNoXml::tagField(EmitNoXml *this,char *ptr,syntax_highlight hl,Datatype *ct,int4 off)

{
  std::operator<<((this->super_EmitXml).s,ptr);
  return;
}

Assistant:

virtual void tagField(const char *ptr,syntax_highlight hl,const Datatype *ct,int4 off) {
    *s << ptr; }